

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::hufBuildDecTable(longlong *hcode,int im,int iM,HufDec *hdecod)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  sbyte sVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  HufDec *pHVar9;
  
  for (lVar6 = (long)im; lVar6 <= iM; lVar6 = lVar6 + 1) {
    uVar5 = hcode[lVar6];
    lVar8 = (long)uVar5 >> 6;
    uVar1 = (uint)uVar5 & 0x3f;
    sVar4 = (sbyte)uVar1;
    if (lVar8 >> sVar4 != 0) break;
    if (uVar1 < 0xf) {
      if ((uVar5 & 0x3f) != 0) {
        pHVar9 = hdecod + (lVar8 << (0xeU - sVar4 & 0x3f));
        for (lVar8 = 1L << (0xeU - sVar4 & 0x3f); 0 < lVar8; lVar8 = lVar8 + -1) {
          if ((*(char *)pHVar9 != '\0') || (pHVar9->p != (int *)0x0)) goto LAB_00120a48;
          *(uint *)pHVar9 = (int)lVar6 << 8 | uVar1;
          pHVar9 = pHVar9 + 1;
        }
      }
    }
    else {
      lVar8 = lVar8 >> (sVar4 - 0xeU & 0x3f);
      if ((char)*(int *)(hdecod + lVar8) != '\0') break;
      pHVar9 = hdecod + lVar8;
      iVar7 = *(int *)(hdecod + lVar8) + 0x100;
      *(int *)pHVar9 = iVar7;
      piVar3 = pHVar9->p;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)operator_new__(4);
        pHVar9->p = piVar3;
      }
      else {
        iVar7 = iVar7 >> 8;
        uVar5 = (long)iVar7 * 4;
        if (iVar7 < 0) {
          uVar5 = 0xffffffffffffffff;
        }
        piVar2 = (int *)operator_new__(uVar5);
        pHVar9->p = piVar2;
        if (iVar7 < 2) {
          iVar7 = 1;
        }
        for (uVar5 = 0; iVar7 - 1 != uVar5; uVar5 = uVar5 + 1) {
          piVar2[uVar5] = piVar3[uVar5];
        }
        operator_delete__(piVar3);
        piVar3 = pHVar9->p;
        iVar7 = *(int *)pHVar9;
      }
      piVar3[(long)(iVar7 >> 8) + -1] = (int)lVar6;
    }
  }
LAB_00120a48:
  return iM < lVar6;
}

Assistant:

bool hufBuildDecTable(const long long *hcode,  // i : encoding table
                      int im,                  // i : min index in hcode
                      int iM,                  // i : max index in hcode
                      HufDec *hdecod)          //  o: (allocated by caller)
//     decoding table [HUF_DECSIZE]
{
  //
  // Init hashtable & loop on all codes.
  // Assumes that hufClearDecTable(hdecod) has already been called.
  //

  for (; im <= iM; im++) {
    long long c = hufCode(hcode[im]);
    int l = hufLength(hcode[im]);

    if (c >> l) {
      //
      // Error: c is supposed to be an l-bit code,
      // but c contains a value that is greater
      // than the largest l-bit number.
      //

      // invalidTableEntry();
      return false;
    }

    if (l > HUF_DECBITS) {
      //
      // Long code: add a secondary entry
      //

      HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

      if (pl->len) {
        //
        // Error: a short code has already
        // been stored in table entry *pl.
        //

        // invalidTableEntry();
        return false;
      }

      pl->lit++;

      if (pl->p) {
        int *p = pl->p;
        pl->p = new int[pl->lit];

        for (int i = 0; i < pl->lit - 1; ++i) pl->p[i] = p[i];

        delete[] p;
      } else {
        pl->p = new int[1];
      }

      pl->p[pl->lit - 1] = im;
    } else if (l) {
      //
      // Short code: init all primary entries
      //

      HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

      for (long long i = 1ULL << (HUF_DECBITS - l); i > 0; i--, pl++) {
        if (pl->len || pl->p) {
          //
          // Error: a short code or a long code has
          // already been stored in table entry *pl.
          //

          // invalidTableEntry();
          return false;
        }

        pl->len = l;
        pl->lit = im;
      }
    }
  }

  return true;
}